

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatNotification.cpp
# Opt level: O0

EC_T_BOOL __thiscall CEmNotification::DequeueJob(CEmNotification *this,PT_SLAVEJOBS pJob)

{
  PT_SLAVEJOBS p_Var1;
  EC_T_BOOL local_1c;
  EC_T_BOOL bRet;
  PT_SLAVEJOBS pJob_local;
  CEmNotification *this_local;
  
  local_1c = 0;
  if ((pJob != (PT_SLAVEJOBS)0x0) &&
     ((this->m_oSlaveJobQueue).pRead != (this->m_oSlaveJobQueue).pWrite)) {
    memcpy(pJob,(this->m_oSlaveJobQueue).pRead,0x5ec);
    p_Var1 = IncrementJobPtr(this,(this->m_oSlaveJobQueue).pRead);
    (this->m_oSlaveJobQueue).pRead = p_Var1;
    local_1c = 1;
  }
  return local_1c;
}

Assistant:

EC_T_BOOL CEmNotification::DequeueJob(
    PT_SLAVEJOBS    pJob    /**< [out]  Dequeued Job Object */
                                     )
{
    EC_T_BOOL bRet = EC_FALSE;

    if ((EC_NULL == pJob) || (m_oSlaveJobQueue.pRead == m_oSlaveJobQueue.pWrite))
    {
        goto Exit;
    }

    OsMemcpy(pJob, m_oSlaveJobQueue.pRead, sizeof(T_SLAVEJOBS));

    /* Increment Read Pointer */
    m_oSlaveJobQueue.pRead = IncrementJobPtr(m_oSlaveJobQueue.pRead);

    bRet = EC_TRUE;
Exit:
    return bRet;
}